

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O0

void non_temporal_encrypt_v256
               (st_ptls_aead_context_t *_ctx,void *_output,ptls_iovec_t *input,size_t incnt,
               uint64_t seq,void *_aad,size_t aadlen)

{
  size_t *psVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  int iVar16;
  size_t sVar17;
  size_t in_RCX;
  ptls_iovec_t *in_RDX;
  aesgcm_context *in_RDI;
  uint64_t in_R8;
  int in_stack_00000008;
  size_t i_3;
  ptls_fusion_aesgcm_ghash_precompute256 *ghash_precompute_2;
  size_t blocks;
  size_t ac_off;
  __m256i k_16;
  __m256i k_15;
  size_t i_2;
  __m256i k_14;
  __m256i k_13;
  __m256i k_12;
  __m256i k_11;
  __m256i k_10;
  __m256i k_9;
  __m256i k_8;
  __m256i k_7;
  __m256i k_6;
  ptls_fusion_aesgcm_ghash_precompute256 *ghash_precompute_1;
  __m256i k_5;
  size_t bytes_copied;
  size_t remaining_ghash_from;
  __m256i k_4;
  __m256i k_3;
  size_t i_1;
  int i;
  ptls_fusion_aesgcm_ghash_precompute256 *ghash_precompute;
  __m256i k_2;
  __m256i k_1;
  __m256i k;
  size_t src_vecleft;
  size_t srclen;
  uint8_t *src;
  ptls_fusion_gfmul_state256 gstate;
  __m256i bits5;
  __m256i bits4;
  __m256i bits3;
  __m256i bits2;
  __m256i bits1;
  __m256i bits0;
  ptls_fusion_aesgcm_context256 *ctx;
  __m256i ac_ek0;
  __m256i ctr;
  uint8_t *encp;
  uint8_t encbuf [288];
  int32_t state;
  uint8_t *aad;
  uint8_t *output;
  aesgcm_context *agctx;
  undefined4 in_stack_ffffffffffffceb8;
  undefined4 in_stack_ffffffffffffcebc;
  uint8_t *in_stack_ffffffffffffcec0;
  size_t local_2e78;
  ulong local_2e70;
  undefined1 local_2e60 [96];
  undefined1 local_2e00 [32];
  ptls_fusion_aesgcm_context_t *local_2d28;
  undefined1 local_2d20 [32];
  undefined1 local_2d00 [32];
  uint8_t *local_2cc8;
  undefined4 local_2b8c;
  aesgcm_context *local_2b78;
  uint64_t local_2b68;
  size_t local_2b60;
  ptls_iovec_t *local_2b58;
  uint8_t local_2b30 [16];
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined1 local_2b10 [16];
  uint local_2b00;
  undefined4 local_2afc;
  int local_2af8;
  undefined4 local_2af4;
  undefined8 uStack_2a80;
  undefined8 uStack_2a78;
  undefined1 local_2a30 [16];
  uint8_t local_2720 [32];
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined1 local_26e0 [32];
  
  local_2b8c = 0;
  local_2b78 = in_RDI;
  local_2b68 = in_R8;
  local_2b60 = in_RCX;
  local_2b58 = in_RDX;
  local_2cc8 = load_preceding_unaligned
                         (in_stack_ffffffffffffcec0,
                          (uint8_t **)CONCAT44(in_stack_ffffffffffffcebc,in_stack_ffffffffffffceb8))
  ;
  calc_counter(local_2b78,local_2b68);
  local_2d00._8_8_ = uStack_2a78;
  local_2d00._0_8_ = uStack_2a80;
  local_2d00._16_8_ = uStack_2a80;
  local_2d00._24_8_ = uStack_2a78;
  local_2d00._16_4_ = 1;
  iVar16 = in_stack_00000008 << 3;
  sVar17 = calc_total_length(local_2b58,local_2b60);
  local_2b00 = (int)sVar17 << 3;
  local_2af4 = 0;
  local_2afc = 0;
  auVar2 = vpinsrd_avx(ZEXT416(local_2b00),0,1);
  auVar2 = vpinsrd_avx(auVar2,iVar16,2);
  local_2b10 = vpinsrd_avx(auVar2,0,3);
  local_2b20 = local_2b10._0_8_;
  uStack_2b18 = local_2b10._8_8_;
  builtin_memcpy(local_2b30,"\x0f\x0e\r\f\v\n\t\b\a\x06\x05\x04\x03\x02\x01",0x10);
  auVar2[8] = '\a';
  auVar2[9] = '\x06';
  auVar2[10] = '\x05';
  auVar2[0xb] = '\x04';
  auVar2[0xc] = '\x03';
  auVar2[0xd] = '\x02';
  auVar2[0xe] = '\x01';
  auVar2[0xf] = '\0';
  auVar2[0] = '\x0f';
  auVar2[1] = '\x0e';
  auVar2[2] = '\r';
  auVar2[3] = '\f';
  auVar2[4] = '\v';
  auVar2[5] = '\n';
  auVar2[6] = '\t';
  auVar2[7] = '\b';
  local_2a30 = vpshufb_avx(local_2b10,auVar2);
  local_2700 = local_2d00._0_8_;
  uStack_26f8 = local_2d00._8_8_;
  uStack_26f0 = local_2d00._16_8_;
  uStack_26e8 = local_2d00._24_8_;
  builtin_memcpy(local_2720,"\x0f\x0e\r\f\v\n\t\b\a\x06\x05\x04\x03\x02\x01",0x10);
  builtin_memcpy(local_2720 + 0x10,"\x0f\x0e\r\f\v\n\t\b\a\x06\x05\x04\x03\x02\x01",0x10);
  auVar3[8] = '\a';
  auVar3[9] = '\x06';
  auVar3[10] = '\x05';
  auVar3[0xb] = '\x04';
  auVar3[0xc] = '\x03';
  auVar3[0xd] = '\x02';
  auVar3[0xe] = '\x01';
  auVar3[0xf] = '\0';
  auVar3[0] = '\x0f';
  auVar3[1] = '\x0e';
  auVar3[2] = '\r';
  auVar3[3] = '\f';
  auVar3[4] = '\v';
  auVar3[5] = '\n';
  auVar3[6] = '\t';
  auVar3[7] = '\b';
  auVar3[0x10] = '\x0f';
  auVar3[0x11] = '\x0e';
  auVar3[0x12] = '\r';
  auVar3[0x13] = '\f';
  auVar3[0x14] = '\v';
  auVar3[0x15] = '\n';
  auVar3[0x16] = '\t';
  auVar3[0x17] = '\b';
  auVar3[0x18] = '\a';
  auVar3[0x19] = '\x06';
  auVar3[0x1a] = '\x05';
  auVar3[0x1b] = '\x04';
  auVar3[0x1c] = '\x03';
  auVar3[0x1d] = '\x02';
  auVar3[0x1e] = '\x01';
  auVar3[0x1f] = '\0';
  auVar3 = vpshufb_avx2(local_2d00,auVar3);
  local_2d20 = vpblendd_avx2(ZEXT1632(local_2a30),auVar3,0xf0);
  local_2d28 = local_2b78->aesgcm;
  local_26e0._8_8_ = SUB328(ZEXT832(0),4);
  local_2e00 = ZEXT832((ulong)local_26e0._8_8_) << 0x40;
  local_2af8 = iVar16;
  local_26e0 = ZEXT832(0) << 0x20;
  memset(local_2e60,0,0x60);
  local_2e78 = local_2b60;
  local_2e70 = 0;
  while (local_2e70 == 0 && local_2e78 != 0) {
    psVar1 = &local_2b58->len;
    local_2b58 = local_2b58 + 1;
    local_2e78 = local_2e78 - 1;
    local_2e70 = *psVar1;
  }
  auVar15[0x10] = '\x02';
  auVar15[0x11] = '\0';
  auVar15[0x12] = '\0';
  auVar15[0x13] = '\0';
  auVar15[0x14] = '\0';
  auVar15[0x15] = '\0';
  auVar15[0x16] = '\0';
  auVar15[0x17] = '\0';
  auVar15._0_16_ = ZEXT816((ulong)2);
  auVar15._24_8_ = 0;
  auVar3 = vpaddq_avx2(local_2d00,auVar15);
  auVar9[8] = '\a';
  auVar9[9] = '\x06';
  auVar9[10] = '\x05';
  auVar9[0xb] = '\x04';
  auVar9[0xc] = '\x03';
  auVar9[0xd] = '\x02';
  auVar9[0xe] = '\x01';
  auVar9[0xf] = '\0';
  auVar9[0] = '\x0f';
  auVar9[1] = '\x0e';
  auVar9[2] = '\r';
  auVar9[3] = '\f';
  auVar9[4] = '\v';
  auVar9[5] = '\n';
  auVar9[6] = '\t';
  auVar9[7] = '\b';
  auVar9[0x10] = '\x0f';
  auVar9[0x11] = '\x0e';
  auVar9[0x12] = '\r';
  auVar9[0x13] = '\f';
  auVar9[0x14] = '\v';
  auVar9[0x15] = '\n';
  auVar9[0x16] = '\t';
  auVar9[0x17] = '\b';
  auVar9[0x18] = '\a';
  auVar9[0x19] = '\x06';
  auVar9[0x1a] = '\x05';
  auVar9[0x1b] = '\x04';
  auVar9[0x1c] = '\x03';
  auVar9[0x1d] = '\x02';
  auVar9[0x1e] = '\x01';
  auVar9[0x1f] = '\0';
  vpshufb_avx2(auVar3,auVar9);
  auVar14[0x10] = '\x02';
  auVar14[0x11] = '\0';
  auVar14[0x12] = '\0';
  auVar14[0x13] = '\0';
  auVar14[0x14] = '\0';
  auVar14[0x15] = '\0';
  auVar14[0x16] = '\0';
  auVar14[0x17] = '\0';
  auVar14._0_16_ = ZEXT816((ulong)2);
  auVar14._24_8_ = 0;
  auVar3 = vpaddq_avx2(auVar3,auVar14);
  auVar8[8] = '\a';
  auVar8[9] = '\x06';
  auVar8[10] = '\x05';
  auVar8[0xb] = '\x04';
  auVar8[0xc] = '\x03';
  auVar8[0xd] = '\x02';
  auVar8[0xe] = '\x01';
  auVar8[0xf] = '\0';
  auVar8[0] = '\x0f';
  auVar8[1] = '\x0e';
  auVar8[2] = '\r';
  auVar8[3] = '\f';
  auVar8[4] = '\v';
  auVar8[5] = '\n';
  auVar8[6] = '\t';
  auVar8[7] = '\b';
  auVar8[0x10] = '\x0f';
  auVar8[0x11] = '\x0e';
  auVar8[0x12] = '\r';
  auVar8[0x13] = '\f';
  auVar8[0x14] = '\v';
  auVar8[0x15] = '\n';
  auVar8[0x16] = '\t';
  auVar8[0x17] = '\b';
  auVar8[0x18] = '\a';
  auVar8[0x19] = '\x06';
  auVar8[0x1a] = '\x05';
  auVar8[0x1b] = '\x04';
  auVar8[0x1c] = '\x03';
  auVar8[0x1d] = '\x02';
  auVar8[0x1e] = '\x01';
  auVar8[0x1f] = '\0';
  vpshufb_avx2(auVar3,auVar8);
  auVar13[0x10] = '\x02';
  auVar13[0x11] = '\0';
  auVar13[0x12] = '\0';
  auVar13[0x13] = '\0';
  auVar13[0x14] = '\0';
  auVar13[0x15] = '\0';
  auVar13[0x16] = '\0';
  auVar13[0x17] = '\0';
  auVar13._0_16_ = ZEXT816((ulong)2);
  auVar13._24_8_ = 0;
  auVar3 = vpaddq_avx2(auVar3,auVar13);
  auVar7[8] = '\a';
  auVar7[9] = '\x06';
  auVar7[10] = '\x05';
  auVar7[0xb] = '\x04';
  auVar7[0xc] = '\x03';
  auVar7[0xd] = '\x02';
  auVar7[0xe] = '\x01';
  auVar7[0xf] = '\0';
  auVar7[0] = '\x0f';
  auVar7[1] = '\x0e';
  auVar7[2] = '\r';
  auVar7[3] = '\f';
  auVar7[4] = '\v';
  auVar7[5] = '\n';
  auVar7[6] = '\t';
  auVar7[7] = '\b';
  auVar7[0x10] = '\x0f';
  auVar7[0x11] = '\x0e';
  auVar7[0x12] = '\r';
  auVar7[0x13] = '\f';
  auVar7[0x14] = '\v';
  auVar7[0x15] = '\n';
  auVar7[0x16] = '\t';
  auVar7[0x17] = '\b';
  auVar7[0x18] = '\a';
  auVar7[0x19] = '\x06';
  auVar7[0x1a] = '\x05';
  auVar7[0x1b] = '\x04';
  auVar7[0x1c] = '\x03';
  auVar7[0x1d] = '\x02';
  auVar7[0x1e] = '\x01';
  auVar7[0x1f] = '\0';
  vpshufb_avx2(auVar3,auVar7);
  auVar12[0x10] = '\x02';
  auVar12[0x11] = '\0';
  auVar12[0x12] = '\0';
  auVar12[0x13] = '\0';
  auVar12[0x14] = '\0';
  auVar12[0x15] = '\0';
  auVar12[0x16] = '\0';
  auVar12[0x17] = '\0';
  auVar12._0_16_ = ZEXT816((ulong)2);
  auVar12._24_8_ = 0;
  auVar3 = vpaddq_avx2(auVar3,auVar12);
  auVar6[8] = '\a';
  auVar6[9] = '\x06';
  auVar6[10] = '\x05';
  auVar6[0xb] = '\x04';
  auVar6[0xc] = '\x03';
  auVar6[0xd] = '\x02';
  auVar6[0xe] = '\x01';
  auVar6[0xf] = '\0';
  auVar6[0] = '\x0f';
  auVar6[1] = '\x0e';
  auVar6[2] = '\r';
  auVar6[3] = '\f';
  auVar6[4] = '\v';
  auVar6[5] = '\n';
  auVar6[6] = '\t';
  auVar6[7] = '\b';
  auVar6[0x10] = '\x0f';
  auVar6[0x11] = '\x0e';
  auVar6[0x12] = '\r';
  auVar6[0x13] = '\f';
  auVar6[0x14] = '\v';
  auVar6[0x15] = '\n';
  auVar6[0x16] = '\t';
  auVar6[0x17] = '\b';
  auVar6[0x18] = '\a';
  auVar6[0x19] = '\x06';
  auVar6[0x1a] = '\x05';
  auVar6[0x1b] = '\x04';
  auVar6[0x1c] = '\x03';
  auVar6[0x1d] = '\x02';
  auVar6[0x1e] = '\x01';
  auVar6[0x1f] = '\0';
  vpshufb_avx2(auVar3,auVar6);
  auVar11[0x10] = '\x02';
  auVar11[0x11] = '\0';
  auVar11[0x12] = '\0';
  auVar11[0x13] = '\0';
  auVar11[0x14] = '\0';
  auVar11[0x15] = '\0';
  auVar11[0x16] = '\0';
  auVar11[0x17] = '\0';
  auVar11._0_16_ = ZEXT816((ulong)2);
  auVar11._24_8_ = 0;
  auVar3 = vpaddq_avx2(auVar3,auVar11);
  auVar5[8] = '\a';
  auVar5[9] = '\x06';
  auVar5[10] = '\x05';
  auVar5[0xb] = '\x04';
  auVar5[0xc] = '\x03';
  auVar5[0xd] = '\x02';
  auVar5[0xe] = '\x01';
  auVar5[0xf] = '\0';
  auVar5[0] = '\x0f';
  auVar5[1] = '\x0e';
  auVar5[2] = '\r';
  auVar5[3] = '\f';
  auVar5[4] = '\v';
  auVar5[5] = '\n';
  auVar5[6] = '\t';
  auVar5[7] = '\b';
  auVar5[0x10] = '\x0f';
  auVar5[0x11] = '\x0e';
  auVar5[0x12] = '\r';
  auVar5[0x13] = '\f';
  auVar5[0x14] = '\v';
  auVar5[0x15] = '\n';
  auVar5[0x16] = '\t';
  auVar5[0x17] = '\b';
  auVar5[0x18] = '\a';
  auVar5[0x19] = '\x06';
  auVar5[0x1a] = '\x05';
  auVar5[0x1b] = '\x04';
  auVar5[0x1c] = '\x03';
  auVar5[0x1d] = '\x02';
  auVar5[0x1e] = '\x01';
  auVar5[0x1f] = '\0';
  vpshufb_avx2(auVar3,auVar5);
  auVar10[0x10] = '\x02';
  auVar10[0x11] = '\0';
  auVar10[0x12] = '\0';
  auVar10[0x13] = '\0';
  auVar10[0x14] = '\0';
  auVar10[0x15] = '\0';
  auVar10[0x16] = '\0';
  auVar10[0x17] = '\0';
  auVar10._0_16_ = ZEXT816((ulong)2);
  auVar10._24_8_ = 0;
  auVar3 = vpaddq_avx2(auVar3,auVar10);
  auVar4[8] = '\a';
  auVar4[9] = '\x06';
  auVar4[10] = '\x05';
  auVar4[0xb] = '\x04';
  auVar4[0xc] = '\x03';
  auVar4[0xd] = '\x02';
  auVar4[0xe] = '\x01';
  auVar4[0xf] = '\0';
  auVar4[0] = '\x0f';
  auVar4[1] = '\x0e';
  auVar4[2] = '\r';
  auVar4[3] = '\f';
  auVar4[4] = '\v';
  auVar4[5] = '\n';
  auVar4[6] = '\t';
  auVar4[7] = '\b';
  auVar4[0x10] = '\x0f';
  auVar4[0x11] = '\x0e';
  auVar4[0x12] = '\r';
  auVar4[0x13] = '\f';
  auVar4[0x14] = '\v';
  auVar4[0x15] = '\n';
  auVar4[0x16] = '\t';
  auVar4[0x17] = '\b';
  auVar4[0x18] = '\a';
  auVar4[0x19] = '\x06';
  auVar4[0x1a] = '\x05';
  auVar4[0x1b] = '\x04';
  auVar4[0x1c] = '\x03';
  auVar4[0x1d] = '\x02';
  auVar4[0x1e] = '\x01';
  auVar4[0x1f] = '\0';
  auVar3 = vpshufb_avx2(auVar3,auVar4);
  if ((local_2e70 < 0xb1) && (local_2e78 == 0)) {
    vpblendd_avx2(auVar3,local_2d20,0xf0);
  }
  halt_baddata();
}

Assistant:

NO_SANITIZE_ADDRESS
static void non_temporal_encrypt_v256(struct st_ptls_aead_context_t *_ctx, void *_output, ptls_iovec_t *input, size_t incnt,
                                      uint64_t seq, const void *_aad, size_t aadlen)
{
/* init the bits (we can always run in full), but use the last slot for calculating ek0, if possible */
#define AESECB6_INIT()                                                                                                             \
    do {                                                                                                                           \
        ctr = _mm256_add_epi64(ctr, incr128x2);                                                                                    \
        bits0 = _mm256_shuffle_epi8(ctr, byteswap256);                                                                             \
        ctr = _mm256_add_epi64(ctr, incr128x2);                                                                                    \
        bits1 = _mm256_shuffle_epi8(ctr, byteswap256);                                                                             \
        ctr = _mm256_add_epi64(ctr, incr128x2);                                                                                    \
        bits2 = _mm256_shuffle_epi8(ctr, byteswap256);                                                                             \
        ctr = _mm256_add_epi64(ctr, incr128x2);                                                                                    \
        bits3 = _mm256_shuffle_epi8(ctr, byteswap256);                                                                             \
        ctr = _mm256_add_epi64(ctr, incr128x2);                                                                                    \
        bits4 = _mm256_shuffle_epi8(ctr, byteswap256);                                                                             \
        ctr = _mm256_add_epi64(ctr, incr128x2);                                                                                    \
        bits5 = _mm256_shuffle_epi8(ctr, byteswap256);                                                                             \
        if (PTLS_UNLIKELY(srclen <= 32 * 6 - 16) && src_vecleft == 0) {                                                            \
            bits5 = _mm256_permute2f128_si256(bits5, ac_ek0, 0x30);                                                                \
            state |= STATE_EK0_READY;                                                                                              \
        }                                                                                                                          \
        __m256i k = ctx->super.ecb.keys.m256[0];                                                                                   \
        bits0 = _mm256_xor_si256(bits0, k);                                                                                        \
        bits1 = _mm256_xor_si256(bits1, k);                                                                                        \
        bits2 = _mm256_xor_si256(bits2, k);                                                                                        \
        bits3 = _mm256_xor_si256(bits3, k);                                                                                        \
        bits4 = _mm256_xor_si256(bits4, k);                                                                                        \
        bits5 = _mm256_xor_si256(bits5, k);                                                                                        \
    } while (0)

/* aes block update */
#define AESECB6_UPDATE(i)                                                                                                          \
    do {                                                                                                                           \
        __m256i k = ctx->super.ecb.keys.m256[i];                                                                                   \
        bits0 = _mm256_aesenc_epi128(bits0, k);                                                                                    \
        bits1 = _mm256_aesenc_epi128(bits1, k);                                                                                    \
        bits2 = _mm256_aesenc_epi128(bits2, k);                                                                                    \
        bits3 = _mm256_aesenc_epi128(bits3, k);                                                                                    \
        bits4 = _mm256_aesenc_epi128(bits4, k);                                                                                    \
        bits5 = _mm256_aesenc_epi128(bits5, k);                                                                                    \
    } while (0)

/* aesenclast */
#define AESECB6_FINAL(i)                                                                                                           \
    do {                                                                                                                           \
        __m256i k = ctx->super.ecb.keys.m256[i];                                                                                   \
        bits0 = _mm256_aesenclast_epi128(bits0, k);                                                                                \
        bits1 = _mm256_aesenclast_epi128(bits1, k);                                                                                \
        bits2 = _mm256_aesenclast_epi128(bits2, k);                                                                                \
        bits3 = _mm256_aesenclast_epi128(bits3, k);                                                                                \
        bits4 = _mm256_aesenclast_epi128(bits4, k);                                                                                \
        bits5 = _mm256_aesenclast_epi128(bits5, k);                                                                                \
    } while (0)

    struct aesgcm_context *agctx = (void *)_ctx;
    uint8_t *output = _output;
    const uint8_t *aad = _aad;

#define STATE_EK0_READY 0x1
    int32_t state = 0;

    /* Bytes are written here first then written using NT store instructions, 64 bytes at a time. */
    uint8_t encbuf[32 * 9] __attribute__((aligned(32))), *encp;

    /* `encbuf` should be large enough to store up to 63-bytes of unaligned bytes, 6 16-byte AES blocks, plus AEAD tag that is
     * append to the ciphertext before writing the bytes to main memory using NT store instructions. */
    PTLS_BUILD_ASSERT(sizeof(encbuf) >= 64 + 6 * 32 + 16);

    /* load unaligned data within same cache line preceding `output`, adjusting pointers accordingly */
    encp = load_preceding_unaligned(encbuf, &output);

    /* setup ctr, retaining Ek(0), len(A) | len(C) to be fed into GCM */
    __m256i ctr = _mm256_broadcastsi128_si256(calc_counter(agctx, seq));
    ctr = _mm256_insert_epi32(ctr, 1, 4);
    __m256i ac_ek0 = _mm256_permute2f128_si256(
        /* first half: ac */
        _mm256_castsi128_si256(
            _mm_shuffle_epi8(_mm_set_epi32(0, (int)aadlen * 8, 0, (int)calc_total_length(input, incnt) * 8), byteswap128)),
        /* second half: ek0 */
        _mm256_shuffle_epi8(ctr, byteswap256), 0x30);

    struct ptls_fusion_aesgcm_context256 *ctx = (void *)agctx->aesgcm;
    __m256i bits0, bits1, bits2, bits3, bits4, bits5 = _mm256_setzero_si256();
    struct ptls_fusion_gfmul_state256 gstate = {0};

    /* find the first non-empty vec */
    const uint8_t *src = NULL;
    size_t srclen = 0, src_vecleft = incnt;
    while (srclen == 0 && src_vecleft != 0) {
        src = (void *)input[0].base;
        srclen = input[0].len;
        ++input;
        --src_vecleft;
    }

    /* Prepare first 6 blocks of bit stream, at the same time calculating ghash of AAD. */
    AESECB6_INIT();
    AESECB6_UPDATE(1);
    AESECB6_UPDATE(2);
    if (PTLS_LIKELY(aadlen != 0)) {
        union ptls_fusion_aesgcm_ghash_precompute256 *ghash_precompute;
        while (PTLS_UNLIKELY(aadlen >= 6 * 32)) {
            ghash_precompute = ctx->ghash + 6;
            gfmul_firststep256(&gstate, _mm256_loadu_si256((void *)aad), 0, --ghash_precompute);
            aad += 32;
            aadlen -= 32;
            for (int i = 1; i < 6; ++i) {
                gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)aad), --ghash_precompute);
                aad += 32;
                aadlen -= 32;
            }
            gfmul_reduce256(&gstate);
        }
        if (PTLS_LIKELY(aadlen != 0)) {
            ghash_precompute = ctx->ghash + (aadlen + 31) / 32;
            if (PTLS_UNLIKELY(aadlen >= 32)) {
                if (aadlen % 32 == 0 || aadlen % 32 > 16) {
                    gfmul_firststep256(&gstate, _mm256_loadu_si256((void *)aad), 0, --ghash_precompute);
                    aad += 32;
                    aadlen -= 32;
                } else {
                    gfmul_firststep256(&gstate, _mm256_loadu_si256((void *)aad), 1, --ghash_precompute);
                    aad += 16;
                    aadlen -= 16;
                }
                while (aadlen >= 32) {
                    gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)aad), --ghash_precompute);
                    aad += 32;
                    aadlen -= 32;
                }
                if (PTLS_LIKELY(aadlen != 0)) {
                    assert(aadlen > 16);
                    gfmul_nextstep256(&gstate, loadn256(aad, aadlen), --ghash_precompute);
                }
            } else {
                gfmul_firststep256(&gstate, loadn256(aad, aadlen), aadlen <= 16, --ghash_precompute);
            }
            assert(ctx->ghash == ghash_precompute);
            gfmul_reduce256(&gstate);
        }
    }
    for (size_t i = 3; i < ctx->super.ecb.rounds; ++i)
        AESECB6_UPDATE(i);
    AESECB6_FINAL(ctx->super.ecb.rounds);

    /* Main loop. This loop:
     *  1. using current keystream (bits0..bits5), xors a up to 6 * 16 bytes and writes to encbuf,
     *  2. then if there is no more data to be encrypted, exit the loop, otherwise,
     *  3. calculate ghash of the blocks being written to encbuf,
     *  4. calculate next 6 * 16 bytes of keystream,
     *  5. writes encbuf in 64-byte blocks
     * When exitting the loop, `remaining_ghash_from` represents the offset within `encbuf` from where ghash remains to be
     * calculated. */
    size_t remaining_ghash_from = encp - encbuf;
    if (srclen != 0) {
        while (1) {
            /* apply the bit stream to input, writing to encbuf */
            if (PTLS_LIKELY(srclen >= 6 * 32)) {
#define APPLY(i) _mm256_storeu_si256((void *)(encp + i * 32), _mm256_xor_si256(_mm256_loadu_si256((void *)(src + i * 32)), bits##i))
                APPLY(0);
                APPLY(1);
                APPLY(2);
                APPLY(3);
                APPLY(4);
                APPLY(5);
#undef APPLY
                encp += 6 * 32;
                src += 6 * 32;
                srclen -= 6 * 32;
                if (PTLS_UNLIKELY(srclen == 0)) {
                    if (src_vecleft == 0) {
                        remaining_ghash_from = (encp - encbuf) - 6 * 32;
                        break;
                    }
                    src = (void *)input[0].base;
                    srclen = input[0].len;
                    ++input;
                    --src_vecleft;
                }
            } else {
                /* slow path, load at most 6 * 32 bytes to encbuf then encrypt in-place */
                size_t bytes_copied = 0;
                do {
                    if (srclen >= 32 && bytes_copied < 5 * 32) {
                        _mm256_storeu_si256((void *)(encp + bytes_copied), _mm256_loadu_si256((void *)src));
                        bytes_copied += 32;
                        src += 32;
                        srclen -= 32;
                    } else {
                        encp[bytes_copied++] = *src++;
                        --srclen;
                    }
                    if (PTLS_UNLIKELY(srclen == 0)) {
                        do {
                            if (src_vecleft == 0)
                                break;
                            src = (void *)input[0].base;
                            srclen = input[0].len;
                            ++input;
                            --src_vecleft;
                        } while (srclen == 0);
                        if (srclen == 0)
                            break;
                    }
                } while (bytes_copied < 6 * 32);
#define APPLY(i)                                                                                                                   \
    _mm256_storeu_si256((void *)(encp + i * 32), _mm256_xor_si256(_mm256_loadu_si256((void *)(encp + i * 32)), bits##i))
                APPLY(0);
                APPLY(1);
                APPLY(2);
                APPLY(3);
                APPLY(4);
                APPLY(5);
#undef APPLY
                encp += bytes_copied;
                if (PTLS_UNLIKELY(srclen == 0)) {
                    /* Calculate amonut of data left to be ghashed, as well as zero-clearing the remainedr of partial block, as it
                     * will be fed into ghash. */
                    remaining_ghash_from = (encp - encbuf) - bytes_copied;
                    if ((bytes_copied & 15) != 0)
                        _mm_storeu_si128((void *)encp, _mm_setzero_si128());
                    break;
                }
            }

            /* Next 96-byte block starts here. Run AES and ghash in parallel while writing output using non-temporal store
             * instructions. */
            AESECB6_INIT();
            union ptls_fusion_aesgcm_ghash_precompute256 *ghash_precompute = ctx->ghash + 6;
            gfmul_firststep256(&gstate, _mm256_loadu_si256((void *)(encp - 6 * 32)), 0, --ghash_precompute);
            AESECB6_UPDATE(1);
            gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)(encp - 5 * 32)), --ghash_precompute);
            AESECB6_UPDATE(2);
            gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)(encp - 4 * 32)), --ghash_precompute);
            AESECB6_UPDATE(3);
            gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)(encp - 3 * 32)), --ghash_precompute);
            AESECB6_UPDATE(4);
            _mm256_stream_si256((void *)output, _mm256_load_si256((void *)encbuf));
            _mm256_stream_si256((void *)(output + 32), _mm256_load_si256((void *)(encbuf + 32)));
            _mm256_stream_si256((void *)(output + 64), _mm256_load_si256((void *)(encbuf + 64)));
            _mm256_stream_si256((void *)(output + 96), _mm256_load_si256((void *)(encbuf + 96)));
            _mm256_stream_si256((void *)(output + 128), _mm256_load_si256((void *)(encbuf + 128)));
            _mm256_stream_si256((void *)(output + 160), _mm256_load_si256((void *)(encbuf + 160)));
            AESECB6_UPDATE(5);
            gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)(encp - 2 * 32)), --ghash_precompute);
            AESECB6_UPDATE(6);
            gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)(encp - 1 * 32)), --ghash_precompute);
            output += 192;
            encp -= 192;
            AESECB6_UPDATE(7);
            _mm256_store_si256((void *)encbuf, _mm256_load_si256((void *)(encbuf + 192)));
            AESECB6_UPDATE(8);
            _mm256_store_si256((void *)(encbuf + 32), _mm256_load_si256((void *)(encbuf + 224)));
            AESECB6_UPDATE(9);
            if (PTLS_UNLIKELY(ctx->super.ecb.rounds != 10)) {
                for (size_t i = 10; PTLS_LIKELY(i < ctx->super.ecb.rounds); ++i)
                    AESECB6_UPDATE(i);
            }
            assert(ctx->ghash == ghash_precompute);
            gfmul_reduce256(&gstate);
            AESECB6_FINAL(ctx->super.ecb.rounds);
        }
    }

    /* Now, All the encrypted bits are built in encbuf. Calculate AEAD tag and append to encbuf. */

    { /* Run ghash against the remaining bytes, after appending `ac` (i.e., len(A) | len(C)). At this point, we might be ghashing 7
       * blocks at once. */
        size_t ac_off = remaining_ghash_from + ((encp - encbuf) - remaining_ghash_from + 15) / 16 * 16;
        _mm_storeu_si128((void *)(encbuf + ac_off), _mm256_castsi256_si128(ac_ek0));
        size_t blocks = ((encp - encbuf) - remaining_ghash_from + 15) / 16 + 1; /* round up, +1 for AC */
        assert(blocks <= 13);
        union ptls_fusion_aesgcm_ghash_precompute256 *ghash_precompute = ctx->ghash + blocks / 2;
        if (blocks % 2 != 0) {
            gfmul_firststep256(&gstate, _mm256_loadu_si256((void *)(encbuf + remaining_ghash_from)), 1, ghash_precompute);
            remaining_ghash_from += 16;
        } else {
            gfmul_firststep256(&gstate, _mm256_loadu_si256((void *)(encbuf + remaining_ghash_from)), 0, --ghash_precompute);
            remaining_ghash_from += 32;
        }
        while (ghash_precompute != ctx->ghash) {
            gfmul_nextstep256(&gstate, _mm256_loadu_si256((void *)(encbuf + remaining_ghash_from)), --ghash_precompute);
            remaining_ghash_from += 32;
        }
        gfmul_reduce256(&gstate);
    }

    /* Calculate EK0, if in the unlikely case on not been done yet. When encoding in full size (16K), EK0 will be ready. */
    if (PTLS_UNLIKELY((state & STATE_EK0_READY) == 0)) {
        bits5 = ac_ek0;
        bits5 = _mm256_xor_si256(bits5, ctx->super.ecb.keys.m256[0]);
        for (size_t i = 1; i < ctx->super.ecb.rounds; ++i)
            bits5 = _mm256_aesenc_epi128(bits5, ctx->super.ecb.keys.m256[i]);
        bits5 = _mm256_aesenclast_epi128(bits5, ctx->super.ecb.keys.m256[ctx->super.ecb.rounds]);
    }

    /* append tag to encbuf */
    _mm_storeu_si128((void *)encp,
                     gfmul_get_tag256(&gstate, _mm256_castsi256_si128(_mm256_permute2f128_si256(bits5, bits5, 0x11))));
    encp += 16;

    /* write remaining bytes */
    write_remaining_bytes(output, encbuf, encp);
}